

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

Vector3D * __thiscall CMU462::Face::normal(Vector3D *__return_storage_ptr__,Face *this)

{
  bool bVar1;
  pointer pHVar2;
  pointer pVVar3;
  _Self local_a8;
  _List_node_base *local_a0;
  Vector3D local_98;
  _List_const_iterator<CMU462::Halfedge> local_80;
  _List_const_iterator<CMU462::Vertex> local_78;
  undefined1 local_70 [8];
  Vector3D pj;
  undefined1 local_50 [8];
  Vector3D pi;
  HalfedgeCIter h;
  Vector3D N;
  Face *this_local;
  
  Vector3D::Vector3D((Vector3D *)&h,0.0,0.0,0.0);
  pi.z = (double)halfedge(this);
  do {
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&pi.z);
    pj.z = (double)Halfedge::vertex(pHVar2);
    pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->
                       ((_List_const_iterator<CMU462::Vertex> *)&pj.z);
    Vector3D::Vector3D((Vector3D *)local_50,&pVVar3->position);
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&pi.z);
    local_80._M_node = (_List_node_base *)Halfedge::next(pHVar2);
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_80);
    local_78._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
    pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_78);
    Vector3D::Vector3D((Vector3D *)local_70,&pVVar3->position);
    cross(&local_98,(Vector3D *)local_50,(Vector3D *)local_70);
    Vector3D::operator+=((Vector3D *)&h,&local_98);
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&pi.z);
    local_a0 = (_List_node_base *)Halfedge::next(pHVar2);
    pi.z = (double)local_a0;
    local_a8._M_node = (_List_node_base *)halfedge(this);
    bVar1 = std::operator!=((_Self *)&pi.z,&local_a8);
  } while (bVar1);
  Vector3D::unit(__return_storage_ptr__,(Vector3D *)&h);
  return __return_storage_ptr__;
}

Assistant:

Vector3D Face::normal() const {
  Vector3D N(0., 0., 0.);

  auto h = halfedge();
  do {
    Vector3D pi = h->vertex()->position;
    Vector3D pj = h->next()->vertex()->position;

    N += cross(pi, pj);

    h = h->next();
  } while (h != halfedge());

  return N.unit();
}